

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O3

bool slang::ast::CallExpression::bindArgs
               (ArgumentListSyntax *argSyntax,
               span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
               formalArgs,string_view symbolName,SourceRange range,ASTContext *context,
               SmallVectorBase<const_slang::ast::Expression_*> *boundArgs,bool isBuiltInMethod)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  FormalArgumentSymbol *this;
  PropertyExprSyntax *initialExpr;
  int iVar3;
  ushort uVar4;
  string_view arg;
  string_view arg_00;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  Diagnostic *pDVar9;
  SourceLocation SVar10;
  char_pointer puVar11;
  ExpressionSyntax *syntax;
  Type *pTVar12;
  uint64_t uVar13;
  FormalArgumentSymbol *pFVar14;
  Expression *pEVar15;
  char_pointer puVar16;
  __extent_storage<18446744073709551615UL> _Var17;
  byte bVar18;
  ulong uVar19;
  SyntaxNode *sv;
  uint uVar20;
  char_pointer puVar21;
  pointer ppFVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  table_element_pointer ppVar26;
  basic_string_view<char,_std::char_traits<char>_> *pbVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  byte bVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  byte bVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  byte bVar46;
  iterator iVar47;
  string_view sVar48;
  SourceRange SVar49;
  SourceRange sourceRange;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> orderedArgs;
  NamedArgMap namedArgs;
  Expression *local_268;
  pointer local_260;
  SyntaxNode *local_258;
  ulong local_250;
  size_t local_248;
  ulong local_240;
  size_t local_238;
  char *local_230;
  Token local_228;
  SourceLocation local_218;
  SourceLocation local_210;
  undefined8 local_208;
  uchar uStack_200;
  uchar uStack_1ff;
  uchar uStack_1fe;
  byte bStack_1fd;
  uchar uStack_1fc;
  uchar uStack_1fb;
  uchar uStack_1fa;
  byte bStack_1f9;
  undefined8 local_1f8;
  uchar uStack_1f0;
  uchar uStack_1ef;
  uchar uStack_1ee;
  byte bStack_1ed;
  uchar uStack_1ec;
  uchar uStack_1eb;
  uchar uStack_1ea;
  byte bStack_1e9;
  ulong local_1e8;
  pointer local_1e0;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> local_1d8 [2];
  uchar local_198;
  uchar uStack_197;
  uchar uStack_196;
  byte bStack_195;
  uchar uStack_194;
  uchar uStack_193;
  uchar uStack_192;
  byte bStack_191;
  uchar uStack_190;
  uchar uStack_18f;
  uchar uStack_18e;
  byte bStack_18d;
  uchar uStack_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  byte bStack_189;
  uchar local_188;
  uchar uStack_187;
  uchar uStack_186;
  byte bStack_185;
  uchar uStack_184;
  uchar uStack_183;
  uchar uStack_182;
  byte bStack_181;
  uchar uStack_180;
  uchar uStack_17f;
  uchar uStack_17e;
  byte bStack_17d;
  uchar uStack_17c;
  uchar uStack_17b;
  uchar uStack_17a;
  byte bStack_179;
  undefined1 local_178 [264];
  undefined1 local_70 [32];
  value_type_pointer ppStack_50;
  size_ctrl_type local_48;
  
  local_230 = symbolName._M_str;
  local_238 = symbolName._M_len;
  _Var17 = formalArgs._M_extent._M_extent_value;
  ppFVar22 = formalArgs._M_ptr;
  local_1d8[0].data_ = (pointer)local_1d8[0].firstElement;
  local_1d8[0].len = 0;
  local_1d8[0].cap = 5;
  local_178._256_8_ = local_178;
  local_70._8_8_ = 0x3f;
  local_70._16_8_ = 1;
  stack0xffffffffffffffa8 = ZEXT816(0x474ad0);
  local_48.ml = 0;
  local_48.size = 0;
  local_70._0_8_ = local_178._256_8_;
  if ((argSyntax == (ArgumentListSyntax *)0x0) ||
     (bVar6 = Expression::collectArgs(context,argSyntax,local_1d8,(NamedArgMap *)local_178), bVar6))
  {
    uVar24 = 0;
    uVar19 = 0;
    local_248 = _Var17._M_extent_value;
    if (_Var17._M_extent_value != 0) {
      local_1e0 = ppFVar22 + _Var17._M_extent_value;
      local_210 = range.startLoc;
      local_218 = range.endLoc;
      uVar23 = 0;
      uVar24 = 0;
      do {
        this = *ppFVar22;
        local_268 = (Expression *)0x0;
        local_260 = ppFVar22;
        local_250 = uVar23;
        if (uVar24 < local_1d8[0].len) {
          local_258 = *(SyntaxNode **)((long)local_1d8[0].data_ + uVar24 * 8);
          if (local_258->kind == EmptyArgument) {
            local_268 = FormalArgumentSymbol::getDefaultValue(this);
            if (local_268 == (Expression *)0x0) {
              SVar49 = slang::syntax::SyntaxNode::sourceRange(local_258);
              pDVar9 = ASTContext::addDiag(context,(DiagCode)0x7,SVar49);
              Diagnostic::operator<<
                        (pDVar9,(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
            }
            else if (!isBuiltInMethod) {
              if (this->direction - Out < 2) {
                if (local_268->kind == Assignment) {
                  pEVar15 = (Expression *)local_268[1].constant;
LAB_00418363:
                  Expression::requireLValue
                            (pEVar15,context,(SourceLocation)0x0,
                             (bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0);
                }
              }
              else if ((this->direction == Ref) &&
                      (pEVar15 = local_268, ((this->super_VariableSymbol).flags.m_bits & 1) == 0))
              goto LAB_00418363;
            }
          }
          else {
            syntax = ASTContext::requireSimpleExpr(context,(PropertyExprSyntax *)local_258);
            if (syntax != (ExpressionSyntax *)0x0) {
              pTVar12 = DeclaredType::getType
                                  (&(this->super_VariableSymbol).super_ValueSymbol.declaredType);
              local_268 = Expression::bindArgument
                                    (pTVar12,this->direction,
                                     (bitmask<slang::ast::VariableFlags>)
                                     (underlying_type)
                                     *(undefined4 *)&(this->super_VariableSymbol).flags,syntax,
                                     context);
            }
          }
          uVar20 = (int)uVar24 + 1;
          pFVar14 = (FormalArgumentSymbol *)
                    &(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
          uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              local_70,(basic_string_view<char,_std::char_traits<char>_> *)pFVar14);
          uVar24 = uVar13 >> (local_70[8] & 0x3f);
          lVar25 = (uVar13 & 0xff) * 4;
          uVar32 = (&UNK_00474b6c)[lVar25];
          uVar33 = (&UNK_00474b6d)[lVar25];
          uVar34 = (&UNK_00474b6e)[lVar25];
          bVar18 = (&UNK_00474b6f)[lVar25];
          uVar19 = 0;
          uVar35 = uVar32;
          uVar36 = uVar33;
          uVar37 = uVar34;
          bVar38 = bVar18;
          uVar39 = uVar32;
          uVar40 = uVar33;
          uVar41 = uVar34;
          bVar42 = bVar18;
          uVar43 = uVar32;
          uVar44 = uVar33;
          uVar45 = uVar34;
          bVar46 = bVar18;
          do {
            uVar5 = local_70._24_8_;
            pgVar1 = (group_type_pointer)(local_70._24_8_ + uVar24 * 0x10);
            local_198 = pgVar1->m[0].n;
            uStack_197 = pgVar1->m[1].n;
            uStack_196 = pgVar1->m[2].n;
            bStack_195 = pgVar1->m[3].n;
            uStack_194 = pgVar1->m[4].n;
            uStack_193 = pgVar1->m[5].n;
            uStack_192 = pgVar1->m[6].n;
            bStack_191 = pgVar1->m[7].n;
            uStack_190 = pgVar1->m[8].n;
            uStack_18f = pgVar1->m[9].n;
            uStack_18e = pgVar1->m[10].n;
            bStack_18d = pgVar1->m[0xb].n;
            uStack_18c = pgVar1->m[0xc].n;
            uStack_18b = pgVar1->m[0xd].n;
            uStack_18a = pgVar1->m[0xe].n;
            bVar7 = pgVar1->m[0xf].n;
            auVar31[0] = -(local_198 == uVar32);
            auVar31[1] = -(uStack_197 == uVar33);
            auVar31[2] = -(uStack_196 == uVar34);
            auVar31[3] = -(bStack_195 == bVar18);
            auVar31[4] = -(uStack_194 == uVar35);
            auVar31[5] = -(uStack_193 == uVar36);
            auVar31[6] = -(uStack_192 == uVar37);
            auVar31[7] = -(bStack_191 == bVar38);
            auVar31[8] = -(uStack_190 == uVar39);
            auVar31[9] = -(uStack_18f == uVar40);
            auVar31[10] = -(uStack_18e == uVar41);
            auVar31[0xb] = -(bStack_18d == bVar42);
            auVar31[0xc] = -(uStack_18c == uVar43);
            auVar31[0xd] = -(uStack_18b == uVar44);
            auVar31[0xe] = -(uStack_18a == uVar45);
            auVar31[0xf] = -(bVar7 == bVar46);
            uVar8 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
            bStack_189 = bVar7;
            if (uVar8 != 0) {
              local_1f8 = CONCAT17(bVar38,CONCAT16(uVar37,CONCAT15(uVar36,CONCAT14(uVar35,CONCAT13(
                                                  bVar18,CONCAT12(uVar34,CONCAT11(uVar33,uVar32)))))
                                                  ));
              ppVar2 = ppStack_50 + uVar24 * 0xf;
              local_240 = uVar19;
              local_208 = pFVar14;
              uStack_1f0 = uVar39;
              uStack_1ef = uVar40;
              uStack_1ee = uVar41;
              bStack_1ed = bVar42;
              uStack_1ec = uVar43;
              uStack_1eb = uVar44;
              uStack_1ea = uVar45;
              bStack_1e9 = bVar46;
              local_1e8 = uVar24;
              do {
                iVar3 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
                  }
                }
                pbVar27 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((long)&(ppVar2->first)._M_len + (ulong)(uint)(iVar3 << 5));
                bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)local_70,
                                   (basic_string_view<char,_std::char_traits<char>_> *)local_208,
                                   pbVar27);
                if (bVar6) {
                  SVar10 = parsing::Token::location((Token *)(pbVar27[1]._M_len + 0x28));
                  pFVar14 = (FormalArgumentSymbol *)
                            ASTContext::addDiag(context,(DiagCode)0x4a0007,SVar10);
                  Diagnostic::operator<<
                            ((Diagnostic *)pFVar14,
                             (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
                  local_228 = slang::syntax::SyntaxNode::getFirstToken(local_258);
                  ppFVar22 = local_260;
                  uVar24 = (ulong)uVar20;
                  SVar10 = parsing::Token::location(&local_228);
                  Diagnostic::addNote((Diagnostic *)pFVar14,(DiagCode)0xc0001,SVar10);
                  *(undefined1 *)&pbVar27[1]._M_str = 1;
                  uVar23 = CONCAT71((int7)((ulong)ppVar2 >> 8),1);
                  goto LAB_00418533;
                }
                uVar8 = uVar8 - 1 & uVar8;
              } while (uVar8 != 0);
              bVar7 = ((group_type_pointer)(uVar5 + uVar24 * 0x10))->m[0xf].n;
              uVar19 = local_240;
              pFVar14 = local_208;
              uVar24 = local_1e8;
              uVar32 = (uchar)local_1f8;
              uVar33 = local_1f8._1_1_;
              uVar34 = local_1f8._2_1_;
              bVar18 = local_1f8._3_1_;
              uVar35 = local_1f8._4_1_;
              uVar36 = local_1f8._5_1_;
              uVar37 = local_1f8._6_1_;
              bVar38 = local_1f8._7_1_;
              uVar39 = uStack_1f0;
              uVar40 = uStack_1ef;
              uVar41 = uStack_1ee;
              bVar42 = bStack_1ed;
              uVar43 = uStack_1ec;
              uVar44 = uStack_1eb;
              uVar45 = uStack_1ea;
              bVar46 = bStack_1e9;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar7) == 0) break;
            lVar25 = uVar24 + uVar19;
            uVar19 = uVar19 + 1;
            uVar24 = lVar25 + 1U & local_70._16_8_;
          } while (uVar19 <= (ulong)local_70._16_8_);
          uVar24 = (ulong)uVar20;
          uVar23 = local_250;
          ppFVar22 = local_260;
          goto LAB_00418533;
        }
        sv = (SyntaxNode *)&(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
        uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            local_70,(basic_string_view<char,_std::char_traits<char>_> *)sv);
        uVar23 = uVar13 >> (local_70[8] & 0x3f);
        lVar25 = (uVar13 & 0xff) * 4;
        uVar32 = (&UNK_00474b6c)[lVar25];
        uVar33 = (&UNK_00474b6d)[lVar25];
        uVar34 = (&UNK_00474b6e)[lVar25];
        bVar18 = (&UNK_00474b6f)[lVar25];
        uVar19 = 0;
        uVar35 = uVar32;
        uVar36 = uVar33;
        uVar37 = uVar34;
        bVar38 = bVar18;
        uVar39 = uVar32;
        uVar40 = uVar33;
        uVar41 = uVar34;
        bVar42 = bVar18;
        uVar43 = uVar32;
        uVar44 = uVar33;
        uVar45 = uVar34;
        bVar46 = bVar18;
        do {
          uVar5 = local_70._24_8_;
          pgVar1 = (group_type_pointer)(local_70._24_8_ + uVar23 * 0x10);
          local_188 = pgVar1->m[0].n;
          uStack_187 = pgVar1->m[1].n;
          uStack_186 = pgVar1->m[2].n;
          bStack_185 = pgVar1->m[3].n;
          uStack_184 = pgVar1->m[4].n;
          uStack_183 = pgVar1->m[5].n;
          uStack_182 = pgVar1->m[6].n;
          bStack_181 = pgVar1->m[7].n;
          uStack_180 = pgVar1->m[8].n;
          uStack_17f = pgVar1->m[9].n;
          uStack_17e = pgVar1->m[10].n;
          bStack_17d = pgVar1->m[0xb].n;
          uStack_17c = pgVar1->m[0xc].n;
          uStack_17b = pgVar1->m[0xd].n;
          uStack_17a = pgVar1->m[0xe].n;
          bVar7 = pgVar1->m[0xf].n;
          auVar30[0] = -(local_188 == uVar32);
          auVar30[1] = -(uStack_187 == uVar33);
          auVar30[2] = -(uStack_186 == uVar34);
          auVar30[3] = -(bStack_185 == bVar18);
          auVar30[4] = -(uStack_184 == uVar35);
          auVar30[5] = -(uStack_183 == uVar36);
          auVar30[6] = -(uStack_182 == uVar37);
          auVar30[7] = -(bStack_181 == bVar38);
          auVar30[8] = -(uStack_180 == uVar39);
          auVar30[9] = -(uStack_17f == uVar40);
          auVar30[10] = -(uStack_17e == uVar41);
          auVar30[0xb] = -(bStack_17d == bVar42);
          auVar30[0xc] = -(uStack_17c == uVar43);
          auVar30[0xd] = -(uStack_17b == uVar44);
          auVar30[0xe] = -(uStack_17a == uVar45);
          auVar30[0xf] = -(bVar7 == bVar46);
          uVar20 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
          bStack_179 = bVar7;
          if (uVar20 != 0) {
            local_208 = (FormalArgumentSymbol *)
                        CONCAT17(bVar38,CONCAT16(uVar37,CONCAT15(uVar36,CONCAT14(uVar35,CONCAT13(
                                                  bVar18,CONCAT12(uVar34,CONCAT11(uVar33,uVar32)))))
                                                ));
            ppVar2 = ppStack_50;
            local_258 = sv;
            local_240 = uVar23;
            uStack_200 = uVar39;
            uStack_1ff = uVar40;
            uStack_1fe = uVar41;
            bStack_1fd = bVar42;
            uStack_1fc = uVar43;
            uStack_1fb = uVar44;
            uStack_1fa = uVar45;
            bStack_1f9 = bVar46;
            local_1f8 = uVar19;
            do {
              pFVar14 = (FormalArgumentSymbol *)(ulong)uVar20;
              iVar3 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
                }
              }
              pbVar27 = (basic_string_view<char,_std::char_traits<char>_> *)
                        ((long)&ppVar2[uVar23 * 0xf].first._M_len + (ulong)(uint)(iVar3 << 5));
              bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )local_70,
                                 (basic_string_view<char,_std::char_traits<char>_> *)local_258,
                                 pbVar27);
              if (bVar6) {
                *(undefined1 *)&pbVar27[1]._M_str = 1;
                initialExpr = *(PropertyExprSyntax **)(pbVar27[1]._M_len + 0x48);
                if (initialExpr != (PropertyExprSyntax *)0x0) {
                  pFVar14 = (FormalArgumentSymbol *)
                            ASTContext::requireSimpleExpr(context,initialExpr);
                  uVar23 = local_250;
                  ppFVar22 = local_260;
                  if (pFVar14 == (FormalArgumentSymbol *)0x0) goto LAB_00418533;
                  pTVar12 = DeclaredType::getType
                                      (&(this->super_VariableSymbol).super_ValueSymbol.declaredType)
                  ;
                  local_268 = Expression::bindArgument
                                        (pTVar12,this->direction,
                                         (bitmask<slang::ast::VariableFlags>)
                                         (underlying_type)
                                         *(undefined4 *)&(this->super_VariableSymbol).flags,
                                         (ExpressionSyntax *)pFVar14,context);
                  goto LAB_0041853f;
                }
                local_268 = FormalArgumentSymbol::getDefaultValue(this);
                uVar23 = local_250;
                ppFVar22 = local_260;
                if (local_268 == (Expression *)0x0) {
                  SVar49 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pbVar27[1]._M_len);
                  pDVar9 = ASTContext::addDiag(context,(DiagCode)0x7,SVar49);
                  Diagnostic::operator<<
                            (pDVar9,(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name
                            );
                  goto LAB_00418533;
                }
                if (isBuiltInMethod) goto LAB_0041853f;
                if (this->direction - Out < 2) {
                  if (local_268->kind != Assignment) goto LAB_00418533;
                  pEVar15 = (Expression *)local_268[1].constant;
                }
                else if ((this->direction != Ref) ||
                        (pEVar15 = local_268, ((this->super_VariableSymbol).flags.m_bits & 1) != 0))
                goto LAB_00418533;
                Expression::requireLValue
                          (pEVar15,context,(SourceLocation)0x0,(bitmask<slang::ast::AssignFlags>)0x0
                           ,(Expression *)0x0);
                goto LAB_00418533;
              }
              uVar20 = uVar20 - 1 & uVar20;
            } while (uVar20 != 0);
            bVar7 = ((group_type_pointer)(uVar5 + uVar23 * 0x10))->m[0xf].n;
            uVar19 = local_1f8;
            sv = local_258;
            uVar23 = local_240;
            uVar32 = (uchar)local_208;
            uVar33 = local_208._1_1_;
            uVar34 = local_208._2_1_;
            bVar18 = local_208._3_1_;
            uVar35 = local_208._4_1_;
            uVar36 = local_208._5_1_;
            uVar37 = local_208._6_1_;
            bVar38 = local_208._7_1_;
            uVar39 = uStack_200;
            uVar40 = uStack_1ff;
            uVar41 = uStack_1fe;
            bVar42 = bStack_1fd;
            uVar43 = uStack_1fc;
            uVar44 = uStack_1fb;
            uVar45 = uStack_1fa;
            bVar46 = bStack_1f9;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar7) == 0) break;
          lVar25 = uVar23 + uVar19;
          uVar19 = uVar19 + 1;
          uVar23 = lVar25 + 1U & local_70._16_8_;
        } while (uVar19 <= (ulong)local_70._16_8_);
        local_268 = FormalArgumentSymbol::getDefaultValue(this);
        uVar23 = local_250;
        ppFVar22 = local_260;
        pFVar14 = this;
        if (local_268 == (Expression *)0x0) {
          if (local_48.size != 0) {
            SVar49.endLoc = local_218;
            SVar49.startLoc = local_210;
            pDVar9 = ASTContext::addDiag(context,(DiagCode)0xa20007,SVar49);
            Diagnostic::operator<<
                      (pDVar9,(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
            goto LAB_00418533;
          }
          sourceRange.endLoc = local_218;
          sourceRange.startLoc = local_210;
          pDVar9 = ASTContext::addDiag(context,(DiagCode)0x9f0007,sourceRange);
          sVar48._M_str = local_230;
          sVar48._M_len = local_238;
          Diagnostic::operator<<(pDVar9,sVar48);
          local_228.kind = (undefined2)local_248;
          local_228._2_1_ = local_248._2_1_;
          local_228.numFlags.raw = local_248._3_1_;
          local_228.rawLen = local_248._4_4_;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&pDVar9->args,(unsigned_long *)&local_228);
          local_228.kind = (undefined2)local_1d8[0].len;
          local_228._2_1_ = local_1d8[0].len._2_1_;
          local_228.numFlags.raw = local_1d8[0].len._3_1_;
          local_228.rawLen = local_1d8[0].len._4_4_;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&pDVar9->args,(unsigned_long *)&local_228);
          uVar19 = 1;
          break;
        }
        if (isBuiltInMethod) {
LAB_0041853f:
          bVar6 = Expression::bad(local_268);
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*const&>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)boundArgs,&local_268);
          uVar19 = CONCAT71((int7)(uVar23 >> 8),(byte)uVar23 | bVar6) & 0xffffffff;
        }
        else {
          if (this->direction - Out < 2) {
            if (local_268->kind == Assignment) {
              pEVar15 = (Expression *)local_268[1].constant;
LAB_0041858c:
              Expression::requireLValue
                        (pEVar15,context,(SourceLocation)0x0,(bitmask<slang::ast::AssignFlags>)0x0,
                         (Expression *)0x0);
            }
          }
          else if ((this->direction == Ref) &&
                  (pEVar15 = local_268, ((this->super_VariableSymbol).flags.m_bits & 1) == 0))
          goto LAB_0041858c;
LAB_00418533:
          uVar19 = CONCAT71((int7)((ulong)pFVar14 >> 8),1);
          if (local_268 != (Expression *)0x0) goto LAB_0041853f;
        }
        ppFVar22 = ppFVar22 + 1;
        uVar23 = uVar19 & 0xffffffff;
      } while (ppFVar22 != local_1e0);
    }
    if (uVar24 < local_1d8[0].len) {
      pDVar9 = ASTContext::addDiag(context,(DiagCode)0xa00007,range);
      arg._M_str = local_230;
      arg._M_len = local_238;
      Diagnostic::operator<<(pDVar9,arg);
      local_228.kind = (undefined2)local_248;
      local_228._2_1_ = local_248._2_1_;
      local_228.numFlags.raw = local_248._3_1_;
      local_228.rawLen = local_248._4_4_;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar9->args,(unsigned_long *)&local_228);
      local_228.kind = (undefined2)local_1d8[0].len;
      local_228._2_1_ = local_1d8[0].len._2_1_;
      local_228.numFlags.raw = local_1d8[0].len._3_1_;
      local_228.rawLen = local_1d8[0].len._4_4_;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar9->args,(unsigned_long *)&local_228);
      uVar19 = 1;
    }
    bVar18 = (byte)uVar19;
    iVar47 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                      *)local_70);
    if (iVar47.p_ != (table_element_pointer)0x0) {
LAB_00417e6c:
      do {
        ppVar26 = iVar47.p_;
        if ((ppVar26->second).second == false) {
          SVar10 = parsing::Token::location(&((ppVar26->second).first)->name);
          pDVar9 = ASTContext::addDiag(context,(DiagCode)0x10007,SVar10);
          sVar48 = parsing::Token::valueText(&((ppVar26->second).first)->name);
          Diagnostic::operator<<(pDVar9,sVar48);
          uVar19 = 1;
          arg_00._M_str = local_230;
          arg_00._M_len = local_238;
          Diagnostic::operator<<(pDVar9,arg_00);
        }
        bVar18 = (byte)uVar19;
        puVar16 = iVar47.pc_ + 0x12;
        puVar21 = iVar47.pc_ + 2;
LAB_00417eca:
        puVar11 = puVar21;
        puVar21 = iVar47.pc_;
        ppVar26 = iVar47.p_ + 1;
        if (((uint)iVar47.pc_ & 0xf) != 0xe) goto code_r0x00417ed8;
        auVar28[0] = -(*puVar11 == '\0');
        auVar28[1] = -(puVar11[1] == '\0');
        auVar28[2] = -(puVar11[2] == '\0');
        auVar28[3] = -(puVar11[3] == '\0');
        auVar28[4] = -(puVar11[4] == '\0');
        auVar28[5] = -(puVar11[5] == '\0');
        auVar28[6] = -(puVar11[6] == '\0');
        auVar28[7] = -(puVar11[7] == '\0');
        auVar28[8] = -(puVar11[8] == '\0');
        auVar28[9] = -(puVar11[9] == '\0');
        auVar28[10] = -(puVar11[10] == '\0');
        auVar28[0xb] = -(puVar11[0xb] == '\0');
        auVar28[0xc] = -(puVar11[0xc] == '\0');
        auVar28[0xd] = -(puVar11[0xd] == '\0');
        auVar28[0xe] = -(puVar11[0xe] == '\0');
        auVar28[0xf] = -(puVar11[0xf] == '\0');
        uVar4 = (ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe;
        while (uVar4 == 0x7fff) {
          ppVar26 = ppVar26 + 0xf;
          auVar29[0] = -(*puVar16 == '\0');
          auVar29[1] = -(puVar16[1] == '\0');
          auVar29[2] = -(puVar16[2] == '\0');
          auVar29[3] = -(puVar16[3] == '\0');
          auVar29[4] = -(puVar16[4] == '\0');
          auVar29[5] = -(puVar16[5] == '\0');
          auVar29[6] = -(puVar16[6] == '\0');
          auVar29[7] = -(puVar16[7] == '\0');
          auVar29[8] = -(puVar16[8] == '\0');
          auVar29[9] = -(puVar16[9] == '\0');
          auVar29[10] = -(puVar16[10] == '\0');
          auVar29[0xb] = -(puVar16[0xb] == '\0');
          auVar29[0xc] = -(puVar16[0xc] == '\0');
          auVar29[0xd] = -(puVar16[0xd] == '\0');
          auVar29[0xe] = -(puVar16[0xe] == '\0');
          auVar29[0xf] = -(puVar16[0xf] == '\0');
          puVar11 = puVar16;
          puVar16 = puVar16 + 0x10;
          uVar4 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe;
        }
        uVar20 = 0;
        if ((uVar4 ^ 0x7fff) != 0) {
          for (; ((uVar4 ^ 0x7fff) >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        if (puVar11[uVar20] == '\x01') break;
        iVar47.p_ = (table_element_pointer)((long)&(ppVar26->first)._M_len + (ulong)(uVar20 << 5));
        iVar47.pc_ = puVar11 + uVar20;
      } while( true );
    }
LAB_00417f5b:
    bVar18 = bVar18 ^ 1;
  }
  else {
    bVar18 = 0;
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_((allocator_type)local_70._0_8_,
            (table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)(local_70 + 8));
  if (local_1d8[0].data_ != (pointer)local_1d8[0].firstElement) {
    operator_delete(local_1d8[0].data_);
  }
  return (bool)(bVar18 & 1);
code_r0x00417ed8:
  iVar47.p_ = ppVar26;
  iVar47.pc_ = puVar21 + 1;
  puVar16 = puVar16 + 1;
  puVar21 = puVar11 + 1;
  if (puVar11[-1] != '\0') goto code_r0x00417ee9;
  goto LAB_00417eca;
code_r0x00417ee9:
  if (puVar11[-1] == '\x01') goto LAB_00417f5b;
  iVar47.pc_ = puVar11 + -1;
  goto LAB_00417e6c;
}

Assistant:

bool CallExpression::bindArgs(const ArgumentListSyntax* argSyntax,
                              std::span<const FormalArgumentSymbol* const> formalArgs,
                              std::string_view symbolName, SourceRange range,
                              const ASTContext& context,
                              SmallVectorBase<const Expression*>& boundArgs, bool isBuiltInMethod) {
    SmallVector<const SyntaxNode*> orderedArgs;
    NamedArgMap namedArgs;
    if (argSyntax) {
        if (!collectArgs(context, *argSyntax, orderedArgs, namedArgs))
            return false;
    }

    // Helper function to register a driver for default value arguments.
    auto addDefaultDriver = [&](const Expression& expr, const FormalArgumentSymbol& formal) {
        if (isBuiltInMethod)
            return;

        switch (formal.direction) {
            case ArgumentDirection::In:
                // Nothing to do for inputs.
                break;
            case ArgumentDirection::Out:
            case ArgumentDirection::InOut:
                // The default value binding should always use bindLValue() which
                // will always return either an AssignmentExpression or a bad expr.
                SLANG_ASSERT(expr.kind == ExpressionKind::Assignment || expr.bad());
                if (expr.kind == ExpressionKind::Assignment)
                    expr.as<AssignmentExpression>().left().requireLValue(context);
                break;
            case ArgumentDirection::Ref:
                if (!formal.flags.has(VariableFlags::Const))
                    expr.requireLValue(context);
                break;
        }
    };

    bool bad = false;
    uint32_t orderedIndex = 0;
    for (auto formal : formalArgs) {
        const Expression* expr = nullptr;
        if (orderedIndex < orderedArgs.size()) {
            auto arg = orderedArgs[orderedIndex++];
            if (arg->kind == SyntaxKind::EmptyArgument) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getDefaultValue();
                if (!expr)
                    context.addDiag(diag::ArgCannotBeEmpty, arg->sourceRange()) << formal->name;
                else
                    addDefaultDriver(*expr, *formal);
            }
            else if (auto exSyn = context.requireSimpleExpr(arg->as<PropertyExprSyntax>())) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction,
                                                 formal->flags, *exSyn, context);
            }

            // Make sure there isn't also a named value for this argument.
            if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
                auto& diag = context.addDiag(diag::DuplicateArgAssignment,
                                             it->second.first->name.location());
                diag << formal->name;
                diag.addNote(diag::NotePreviousUsage, arg->getFirstToken().location());
                it->second.second = true;
                bad = true;
            }
        }
        else if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
            // Mark this argument as used so that we can later detect if
            // any were unused.
            it->second.second = true;

            auto arg = it->second.first->expr;
            if (!arg) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getDefaultValue();
                if (!expr) {
                    context.addDiag(diag::ArgCannotBeEmpty, it->second.first->sourceRange())
                        << formal->name;
                }
                else {
                    addDefaultDriver(*expr, *formal);
                }
            }
            else if (auto exSyn = context.requireSimpleExpr(*arg)) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction,
                                                 formal->flags, *exSyn, context);
            }
        }
        else {
            expr = formal->getDefaultValue();
            if (!expr) {
                if (namedArgs.empty()) {
                    auto& diag = context.addDiag(diag::TooFewArguments, range);
                    diag << symbolName;
                    diag << formalArgs.size() << orderedArgs.size();
                    bad = true;
                    break;
                }
                else {
                    context.addDiag(diag::UnconnectedArg, range) << formal->name;
                }
            }
            else {
                addDefaultDriver(*expr, *formal);
            }
        }

        if (!expr) {
            bad = true;
        }
        else {
            bad |= expr->bad();
            boundArgs.push_back(expr);
        }
    }

    // Make sure there weren't too many ordered arguments provided.
    if (orderedIndex < orderedArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, range);
        diag << symbolName;
        diag << formalArgs.size();
        diag << orderedArgs.size();
        bad = true;
    }

    for (const auto& pair : namedArgs) {
        // We marked all the args that we used, so anything left over is an arg assignment
        // for a non-existent arg.
        if (!pair.second.second) {
            auto& diag = context.addDiag(diag::ArgDoesNotExist, pair.second.first->name.location());
            diag << pair.second.first->name.valueText();
            diag << symbolName;
            bad = true;
        }
    }

    return !bad;
}